

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void geomCallback(sqlite3_context *ctx,int nArg,sqlite3_value **aArg)

{
  u64 n;
  undefined8 *puVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  undefined4 *pPtr;
  sqlite3_value *psVar8;
  ulong uVar9;
  
  puVar1 = (undefined8 *)ctx->pFunc->pUserData;
  iVar7 = sqlite3_initialize();
  if (iVar7 == 0) {
    n = (long)nArg * 0x10 + 0x38;
    pPtr = (undefined4 *)sqlite3Malloc(n);
    if (pPtr != (undefined4 *)0x0) {
      *pPtr = (int)n;
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar5 = puVar1[3];
      *(undefined8 *)(pPtr + 2) = *puVar1;
      *(undefined8 *)(pPtr + 4) = uVar3;
      *(undefined8 *)(pPtr + 6) = uVar4;
      *(undefined8 *)(pPtr + 8) = uVar5;
      *(undefined4 **)(pPtr + 0xc) = pPtr + (long)nArg * 2 + 0xe;
      pPtr[10] = nArg;
      if (0 < nArg) {
        uVar9 = 0;
        bVar6 = false;
        do {
          psVar8 = sqlite3_value_dup(aArg[uVar9]);
          *(sqlite3_value **)(*(long *)(pPtr + 0xc) + uVar9 * 8) = psVar8;
          if (*(long *)(*(long *)(pPtr + 0xc) + uVar9 * 8) == 0) {
            bVar6 = true;
          }
          dVar2 = sqlite3VdbeRealValue(aArg[uVar9]);
          *(double *)(pPtr + uVar9 * 2 + 0xe) = dVar2;
          uVar9 = uVar9 + 1;
        } while ((uint)nArg != uVar9);
        if (bVar6) {
          sqlite3_result_error_nomem(ctx);
          rtreeMatchArgFree(pPtr);
          return;
        }
      }
      sqlite3_result_pointer(ctx,pPtr,"RtreeMatchArg",rtreeMatchArgFree);
      return;
    }
  }
  sqlite3_result_error_nomem(ctx);
  return;
}

Assistant:

static void geomCallback(sqlite3_context *ctx, int nArg, sqlite3_value **aArg){
  RtreeGeomCallback *pGeomCtx = (RtreeGeomCallback *)sqlite3_user_data(ctx);
  RtreeMatchArg *pBlob;
  sqlite3_int64 nBlob;
  int memErr = 0;

  nBlob = sizeof(RtreeMatchArg) + (nArg-1)*sizeof(RtreeDValue)
           + nArg*sizeof(sqlite3_value*);
  pBlob = (RtreeMatchArg *)sqlite3_malloc64(nBlob);
  if( !pBlob ){
    sqlite3_result_error_nomem(ctx);
  }else{
    int i;
    pBlob->iSize = nBlob;
    pBlob->cb = pGeomCtx[0];
    pBlob->apSqlParam = (sqlite3_value**)&pBlob->aParam[nArg];
    pBlob->nParam = nArg;
    for(i=0; i<nArg; i++){
      pBlob->apSqlParam[i] = sqlite3_value_dup(aArg[i]);
      if( pBlob->apSqlParam[i]==0 ) memErr = 1;
#ifdef SQLITE_RTREE_INT_ONLY
      pBlob->aParam[i] = sqlite3_value_int64(aArg[i]);
#else
      pBlob->aParam[i] = sqlite3_value_double(aArg[i]);
#endif
    }
    if( memErr ){
      sqlite3_result_error_nomem(ctx);
      rtreeMatchArgFree(pBlob);
    }else{
      sqlite3_result_pointer(ctx, pBlob, "RtreeMatchArg", rtreeMatchArgFree);
    }
  }
}